

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

void __thiscall
boost::ext::ut::v1_1_8::runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,16>
::on<void(*)(),boost::ext::ut::v1_1_8::none>
          (runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,16> *this,
          test<void_(*)(),_boost::ext::ut::v1_1_8::none> *test)

{
  long lVar1;
  skip<boost::ext::ut::v1_1_8::none> test_00;
  skip<boost::ext::ut::v1_1_8::none> test_01;
  test_begin test_begin;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  string_view pattern;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  test_run test_run;
  test_end tVar14;
  bool bVar15;
  reference pvVar16;
  reference pbVar17;
  ostream *__os;
  char *pcVar18;
  basic_string_view<char,_std::char_traits<char>_> bVar19;
  fatal_assertion *anon_var_0;
  exception *exception;
  uint local_154;
  uint i;
  undefined4 uStack_104;
  undefined8 local_e0;
  basic_string_view<char,_std::char_traits<char>_> *ftag;
  iterator __end5;
  iterator __begin5;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range5;
  undefined8 local_78;
  string_view local_70;
  string_view local_60;
  reference local_50;
  string_view *tag;
  iterator __end0;
  iterator __begin0;
  vector<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  *__range4;
  size_t sStack_28;
  bool execute;
  char *local_20;
  test<void_(*)(),_boost::ext::ut::v1_1_8::none> *test_local;
  runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16> *this_local;
  
  bVar19 = utility::string_view::operator_cast_to_basic_string_view(&test->name);
  pvVar16 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_16UL>::operator[]
                      ((array<std::basic_string_view<char,_std::char_traits<char>_>,_16UL> *)
                       (this + 0x218),*(size_type *)(this + 0x200));
  sStack_28 = bVar19._M_len;
  pvVar16->_M_len = sStack_28;
  local_20 = bVar19._M_str;
  pvVar16->_M_str = local_20;
  __range4._7_1_ =
       std::
       empty<std::vector<boost::ext::ut::v1_1_8::utility::string_view,std::allocator<boost::ext::ut::v1_1_8::utility::string_view>>>
                 (&test->tag);
  __end0 = std::
           vector<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
           ::begin(&test->tag);
  tag = (string_view *)
        std::
        vector<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
        ::end(&test->tag);
  do {
    bVar15 = __gnu_cxx::
             operator==<boost::ext::ut::v1_1_8::utility::string_view_*,_std::vector<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>_>
                       (&__end0,(__normal_iterator<boost::ext::ut::v1_1_8::utility::string_view_*,_std::vector<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>_>
                                 *)&tag);
    if (((bVar15 ^ 0xffU) & 1) == 0) {
      if (__range4._7_1_ == false) {
        uVar6 = (test->type).data_;
        uVar7 = (test->type).size_;
        test_01.type.size_ = uVar7;
        test_01.type.data_ = (char *)uVar6;
        uVar8 = (test->name).data_;
        uVar9 = (test->name).size_;
        test_01.name.size_ = uVar9;
        test_01.name.data_ = (char *)uVar8;
        test_01._32_8_ = local_e0;
        runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16>::
        on<boost::ext::ut::v1_1_8::none>
                  ((runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16> *)
                   this,test_01);
      }
      else {
        bVar15 = filter::operator()(this + 0x318,*(size_t *)(this + 0x200),
                                    (array<std::basic_string_view<char,_std::char_traits<char>_>,_16UL>
                                     *)(this + 0x218));
        if (bVar15) {
          lVar1 = *(long *)(this + 0x200);
          *(long *)(this + 0x200) = lVar1 + 1;
          if (lVar1 == 0) {
            uVar10 = (test->type).data_;
            uVar11 = (test->type).size_;
            test_begin.type.size_ = uVar11;
            test_begin.type.data_ = (char *)uVar10;
            uVar12 = (test->name).data_;
            uVar13 = (test->name).size_;
            test_begin.name.size_ = uVar13;
            test_begin.name.data_ = (char *)uVar12;
            test_begin.location._12_4_ = uStack_104;
            test_begin.location.line_ = (test->location).line_;
            test_begin.location.file_ = (test->location).file_;
            reporter<boost::ext::ut::v1_1_8::printer>::on
                      ((reporter<boost::ext::ut::v1_1_8::printer> *)this,test_begin);
          }
          else {
            test_run.type = test->type;
            test_run.name = test->name;
            reporter<boost::ext::ut::v1_1_8::printer>::on
                      ((reporter<boost::ext::ut::v1_1_8::printer> *)this,test_run);
          }
          if (((byte)this[0x348] & 1) != 0) {
            for (local_154 = 0; (ulong)local_154 < *(ulong *)(this + 0x200);
                local_154 = local_154 + 1) {
              pcVar18 = "";
              if (local_154 != 0) {
                pcVar18 = ".";
              }
              __os = std::operator<<((ostream *)&std::cout,pcVar18);
              pvVar16 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_16UL>::
                        operator[]((array<std::basic_string_view<char,_std::char_traits<char>_>,_16UL>
                                    *)(this + 0x218),(ulong)local_154);
              bVar19._M_len = pvVar16->_M_len;
              bVar19._M_str = pvVar16->_M_str;
              std::operator<<(__os,bVar19);
            }
            std::operator<<((ostream *)&std::cout,'\n');
          }
          events::test<void_(*)(),_boost::ext::ut::v1_1_8::none>::operator()(test);
          lVar1 = *(long *)(this + 0x200);
          *(long *)(this + 0x200) = lVar1 + -1;
          if (lVar1 + -1 == 0) {
            tVar14.type = test->type;
            tVar14.name = test->name;
            reporter<boost::ext::ut::v1_1_8::printer>::on
                      ((reporter<boost::ext::ut::v1_1_8::printer> *)this,tVar14);
          }
        }
      }
      return;
    }
    local_50 = __gnu_cxx::
               __normal_iterator<boost::ext::ut::v1_1_8::utility::string_view_*,_std::vector<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>_>
               ::operator*(&__end0);
    local_60 = utility::string_view::operator_cast_to_basic_string_view(local_50);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_70,"skip");
    bVar15 = utility::is_match(local_60,local_70);
    if (bVar15) {
      uVar2 = (test->type).data_;
      uVar3 = (test->type).size_;
      test_00.type.size_ = uVar3;
      test_00.type.data_ = (char *)uVar2;
      uVar4 = (test->name).data_;
      uVar5 = (test->name).size_;
      test_00.name.size_ = uVar5;
      test_00.name.data_ = (char *)uVar4;
      test_00._32_8_ = local_78;
      runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16>::
      on<boost::ext::ut::v1_1_8::none>
                ((runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16> *)
                 this,test_00);
      return;
    }
    __end5 = std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)(this + 0x330));
    ftag = (basic_string_view<char,_std::char_traits<char>_> *)
           std::
           vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)(this + 0x330));
    while (bVar15 = __gnu_cxx::
                    operator==<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                              (&__end5,(__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                        *)&ftag), ((bVar15 ^ 0xffU) & 1) != 0) {
      pbVar17 = __gnu_cxx::
                __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                ::operator*(&__end5);
      bVar19 = utility::string_view::operator_cast_to_basic_string_view(local_50);
      pattern._M_len = pbVar17->_M_len;
      pattern._M_str = pbVar17->_M_str;
      bVar15 = utility::is_match(bVar19,pattern);
      if (bVar15) {
        __range4._7_1_ = true;
        break;
      }
      __gnu_cxx::
      __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::operator++(&__end5);
    }
    __gnu_cxx::
    __normal_iterator<boost::ext::ut::v1_1_8::utility::string_view_*,_std::vector<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>_>
    ::operator++(&__end0);
  } while( true );
}

Assistant:

auto on(events::test<Ts...> test) {
      path_[level_] = test.name;

      auto execute = std::empty(test.tag);
      for (const auto& tag : test.tag) {
        if (utility::is_match(tag, "skip")) {
          on(events::skip<>{.type = test.type, .name = test.name});
          return;
        }

        for (const auto& ftag : tag_) {
          if (utility::is_match(tag, ftag)) {
            execute = true;
            break;
          }
        }
      }

      if (not execute) {
        on(events::skip<>{.type = test.type, .name = test.name});
        return;
      }

      if (filter_(level_, path_)) {
        if (not level_++) {
          reporter_.on(events::test_begin{
              .type = test.type, .name = test.name, .location = test.location});
        } else {
          reporter_.on(events::test_run{.type = test.type, .name = test.name});
        }

        if (dry_run_) {
          for (auto i = 0u; i < level_; ++i) {
            std::cout << (i ? "." : "") << path_[i];
          }
          std::cout << '\n';
        }

#if defined(__cpp_exceptions)
        try {
#endif
          test();
#if defined(__cpp_exceptions)
        } catch (const events::fatal_assertion&) {
        } catch (const std::exception& exception) {
          ++fails_;
          reporter_.on(events::exception{exception.what()});
        } catch (...) {
          ++fails_;
          reporter_.on(events::exception{"Unknown exception"});
        }
#endif

        if (not--level_) {
          reporter_.on(events::test_end{.type = test.type, .name = test.name});
        }
      }
    }